

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall
CConnman::GetNodeStats(CConnman *this,vector<CNodeStats,_std::allocator<CNodeStats>_> *vstats)

{
  long lVar1;
  bool bVar2;
  CNode *this_00;
  reference ppCVar3;
  reference pvVar4;
  long in_RDI;
  long in_FS_OFFSET;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock92;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff78;
  CNetAddr *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  CNode *stats;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffb0;
  vector<CNodeStats,_std::allocator<CNodeStats>_> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CNodeStats,_std::allocator<CNodeStats>_>::clear
            ((vector<CNodeStats,_std::allocator<CNodeStats>_> *)in_stack_ffffffffffffff78);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::vector<CNode_*,_std::allocator<CNode_*>_>::size
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff78);
  std::vector<CNodeStats,_std::allocator<CNodeStats>_>::reserve
            (in_stack_ffffffffffffffb8,(size_type)in_stack_ffffffffffffffb0);
  this_00 = (CNode *)(in_RDI + 0x178);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff80);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff80);
  while( true ) {
    bVar2 = __gnu_cxx::operator==<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                      ((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                        *)in_stack_ffffffffffffff80);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppCVar3 = __gnu_cxx::
              __normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
              operator*((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                         *)in_stack_ffffffffffffff78);
    stats = *ppCVar3;
    std::vector<CNodeStats,_std::allocator<CNodeStats>_>::emplace_back<>
              ((vector<CNodeStats,_std::allocator<CNodeStats>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<CNodeStats,_std::allocator<CNodeStats>_>::back
              ((vector<CNodeStats,_std::allocator<CNodeStats>_> *)in_stack_ffffffffffffff78);
    CNode::CopyStats(this_00,(CNodeStats *)stats);
    in_stack_ffffffffffffff8c =
         GetMappedAS((CConnman *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff80);
    pvVar4 = std::vector<CNodeStats,_std::allocator<CNodeStats>_>::back
                       ((vector<CNodeStats,_std::allocator<CNodeStats>_> *)in_stack_ffffffffffffff78
                       );
    pvVar4->m_mapped_as = in_stack_ffffffffffffff8c;
    __gnu_cxx::__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *
               )in_stack_ffffffffffffff78);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::GetNodeStats(std::vector<CNodeStats>& vstats) const
{
    vstats.clear();
    LOCK(m_nodes_mutex);
    vstats.reserve(m_nodes.size());
    for (CNode* pnode : m_nodes) {
        vstats.emplace_back();
        pnode->CopyStats(vstats.back());
        vstats.back().m_mapped_as = GetMappedAS(pnode->addr);
    }
}